

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int encode_string(char *dst,size_t dst_len,argon2_context *ctx,argon2_type type)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  char tmp [30];
  char acStack_58 [40];
  
  pcVar2 = argon2_type2string(type,0);
  iVar1 = validate_inputs(ctx);
  if (pcVar2 != (char *)0x0) {
    if (iVar1 != 0) {
      return iVar1;
    }
    if (1 < dst_len) {
      dst[0] = '$';
      dst[1] = '\0';
      pcVar5 = dst + 1;
      uVar6 = dst_len - 1;
      sVar3 = strlen(pcVar2);
      uVar7 = uVar6;
      if (sVar3 <= uVar6 && uVar6 - sVar3 != 0) {
        memcpy(pcVar5,pcVar2,sVar3 + 1);
        pcVar5 = pcVar5 + sVar3;
        uVar7 = uVar6 - sVar3;
      }
      if ((sVar3 < uVar6) && (3 < uVar7)) {
        builtin_strncpy(pcVar5,"$v=",4);
        pcVar5 = pcVar5 + 3;
        uVar7 = uVar7 - 3;
        sprintf(acStack_58,"%lu",(ulong)ctx->version);
        sVar3 = strlen(acStack_58);
        uVar6 = uVar7;
        if (sVar3 <= uVar7 && uVar7 - sVar3 != 0) {
          memcpy(pcVar5,acStack_58,sVar3 + 1);
          pcVar5 = pcVar5 + sVar3;
          uVar6 = uVar7 - sVar3;
        }
        if ((sVar3 < uVar7) && (3 < uVar6)) {
          builtin_strncpy(pcVar5,"$m=",4);
          pcVar5 = pcVar5 + 3;
          uVar6 = uVar6 - 3;
          sprintf(acStack_58,"%lu",(ulong)ctx->m_cost);
          sVar3 = strlen(acStack_58);
          uVar7 = uVar6;
          if (sVar3 <= uVar6 && uVar6 - sVar3 != 0) {
            memcpy(pcVar5,acStack_58,sVar3 + 1);
            pcVar5 = pcVar5 + sVar3;
            uVar7 = uVar6 - sVar3;
          }
          if ((sVar3 < uVar6) && (3 < uVar7)) {
            builtin_strncpy(pcVar5,",t=",4);
            pcVar5 = pcVar5 + 3;
            uVar7 = uVar7 - 3;
            sprintf(acStack_58,"%lu",(ulong)ctx->t_cost);
            sVar3 = strlen(acStack_58);
            uVar6 = uVar7;
            if (sVar3 <= uVar7 && uVar7 - sVar3 != 0) {
              memcpy(pcVar5,acStack_58,sVar3 + 1);
              pcVar5 = pcVar5 + sVar3;
              uVar6 = uVar7 - sVar3;
            }
            if ((sVar3 < uVar7) && (3 < uVar6)) {
              builtin_strncpy(pcVar5,",p=",4);
              pcVar5 = pcVar5 + 3;
              uVar6 = uVar6 - 3;
              sprintf(acStack_58,"%lu",(ulong)ctx->lanes);
              sVar3 = strlen(acStack_58);
              uVar7 = uVar6;
              if (sVar3 <= uVar6 && uVar6 - sVar3 != 0) {
                memcpy(pcVar5,acStack_58,sVar3 + 1);
                pcVar5 = pcVar5 + sVar3;
                uVar7 = uVar6 - sVar3;
              }
              if ((sVar3 < uVar6) && (1 < uVar7)) {
                pcVar5[0] = '$';
                pcVar5[1] = '\0';
                sVar4 = to_base64(pcVar5 + 1,uVar7 - 1,ctx->salt,(ulong)ctx->saltlen);
                if (sVar4 != 0xffffffffffffffff) {
                  uVar7 = (uVar7 - 1) - sVar4;
                  pcVar2 = pcVar5 + 1 + sVar4;
                  if (uVar7 < 2) {
                    return -0x1f;
                  }
                  pcVar2[0] = '$';
                  pcVar2[1] = '\0';
                  sVar4 = to_base64(pcVar2 + 1,uVar7 - 1,ctx->out,(ulong)ctx->outlen);
                  if (sVar4 != 0xffffffffffffffff) {
                    return 0;
                  }
                  return -0x1f;
                }
              }
            }
          }
        }
      }
    }
  }
  return -0x1f;
}

Assistant:

int encode_string(char *dst, size_t dst_len, argon2_context *ctx,
                  argon2_type type) {
#define SS(str)                                                                \
    do {                                                                       \
        size_t pp_len = strlen(str);                                           \
        if (pp_len >= dst_len) {                                               \
            return ARGON2_ENCODING_FAIL;                                       \
        }                                                                      \
        memcpy(dst, str, pp_len + 1);                                          \
        dst += pp_len;                                                         \
        dst_len -= pp_len;                                                     \
    } while ((void)0, 0)

#define SX(x)                                                                  \
    do {                                                                       \
        char tmp[30];                                                          \
        sprintf(tmp, "%lu", (unsigned long)(x));                               \
        SS(tmp);                                                               \
    } while ((void)0, 0)

#define SB(buf, len)                                                           \
    do {                                                                       \
        size_t sb_len = to_base64(dst, dst_len, buf, len);                     \
        if (sb_len == (size_t)-1) {                                            \
            return ARGON2_ENCODING_FAIL;                                       \
        }                                                                      \
        dst += sb_len;                                                         \
        dst_len -= sb_len;                                                     \
    } while ((void)0, 0)

    const char* type_string = argon2_type2string(type, 0);
    int validation_result = validate_inputs(ctx);

    if (!type_string) {
        return ARGON2_ENCODING_FAIL;
    }

    if (validation_result != ARGON2_OK) {
        return validation_result;
    }

    SS("$");
    SS(type_string);

    SS("$v=");
    SX(ctx->version);

    SS("$m=");
    SX(ctx->m_cost);
    SS(",t=");
    SX(ctx->t_cost);
    SS(",p=");
    SX(ctx->lanes);

    SS("$");
    SB(ctx->salt, ctx->saltlen);

    SS("$");
    SB(ctx->out, ctx->outlen);
    return ARGON2_OK;

#undef SS
#undef SX
#undef SB
}